

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

const_iterator __thiscall qpdf::Array::cend(Array *this)

{
  bool bVar1;
  pointer this_00;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_40;
  QPDF_Array *local_20;
  QPDF_Array *a;
  Array *this_local;
  
  a = (QPDF_Array *)this;
  local_20 = BaseHandle::as<QPDF_Array>(&this->super_BaseHandle);
  if (local_20 == (QPDF_Array *)0x0) {
    __gnu_cxx::
    __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::__normal_iterator((__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                         *)&this_local);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_20);
    if (bVar1) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->sp_elements);
      if (!bVar1) {
        getAsVector(&local_40,this);
        std::
        make_unique<std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   &stack0xffffffffffffffd8);
        std::
        unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::operator=(&this->sp_elements,
                    (unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                     *)&stack0xffffffffffffffd8);
        std::
        unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                       *)&stack0xffffffffffffffd8);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_40);
      }
      this_00 = std::
                unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                ::operator->(&this->sp_elements);
      this_local = (Array *)std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::cend
                                      (this_00);
    }
    else {
      this_local = (Array *)std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::cend
                                      (&local_20->elements);
    }
  }
  return (const_iterator)(QPDFObjectHandle *)this_local;
}

Assistant:

Array::const_iterator
Array::cend()
{
    if (auto a = as<QPDF_Array>()) {
        if (!a->sp) {
            return a->elements.cend();
        }
        if (!sp_elements) {
            sp_elements = std::make_unique<std::vector<QPDFObjectHandle>>(getAsVector());
        }
        return sp_elements->cend();
    }
    return {};
}